

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operation.cpp
# Opt level: O1

void operation::scalarProductT(tensor *res,tensor a,tensor b,int *size)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  tensor ppplVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  iVar1 = size[2];
  if (0 < (long)iVar1) {
    uVar2 = size[1];
    lVar6 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar3 = *size;
        uVar5 = 0;
        do {
          if (0 < (int)uVar3) {
            ppplVar4 = *res;
            uVar7 = 0;
            do {
              ppplVar4[uVar7][uVar5][lVar6] = b[uVar7][uVar5][lVar6] * a[uVar7][uVar5][lVar6];
              uVar7 = uVar7 + 1;
            } while (uVar3 != uVar7);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar2);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar1);
  }
  return;
}

Assistant:

void scalarProductT(type::tensor* res, type::tensor a, type::tensor b, int size[])
    {
        for(int i(0); i < size[2]; i++)
            for(int j(0); j < size[1]; j++)
                for(int k(0); k < size[0]; k++)
                    (*res)[k][j][i] = a[k][j][i] * b[k][j][i];
    }